

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O0

void __thiscall
five_point_solver::five_point_solver
          (five_point_solver *this,field3d<celle> *ce0,field3d<cellb> *cb0,field3d<cellj> *cj0,
          double dt,double dx,double dy,double dz)

{
  double *pdVar1;
  field3d<cellj> *in_RCX;
  field3d<cellb> *in_RDX;
  field3d<celle> *in_RSI;
  maxwell_solver *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  double in_XMM1_Qa;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double local_80;
  double local_78;
  double local_70;
  double local_68 [3];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_40 = in_XMM3_Qa;
  local_38 = in_XMM2_Qa;
  local_30 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  maxwell_solver::maxwell_solver
            (in_RDI,in_RSI,in_RDX,in_RCX,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa);
  in_RDI->_vptr_maxwell_solver = (_func_int **)&PTR_advance_b_00192bc0;
  dVar2 = local_30 / local_28;
  local_48 = 1.0;
  local_50 = local_28 / local_30;
  pdVar1 = std::min<double>(&local_48,&local_50);
  auVar4._0_8_ = sin(*pdVar1 * 1.5707963267948966);
  auVar4._8_56_ = extraout_var;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar3 = vfnmadd213sd_fma(auVar4._0_16_,auVar7,ZEXT816(0x3ff0000000000000));
  in_RDI[1]._vptr_maxwell_solver = (_func_int **)(auVar3._0_8_ * 0.25);
  dVar2 = local_38 / local_28;
  local_68[0] = 1.0;
  local_70 = local_28 / local_38;
  pdVar1 = std::min<double>(local_68,&local_70);
  auVar5._0_8_ = sin(*pdVar1 * 1.5707963267948966);
  auVar5._8_56_ = extraout_var_00;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  auVar3 = vfnmadd213sd_fma(auVar5._0_16_,auVar8,ZEXT816(0x3ff0000000000000));
  in_RDI[1].ce = (field3d<celle> *)(auVar3._0_8_ * 0.25);
  local_78 = 1.0;
  local_80 = local_28 / local_40;
  pdVar1 = std::min<double>(&local_78,&local_80);
  auVar6._0_8_ = sin(*pdVar1 * 1.5707963267948966);
  auVar6._8_56_ = extraout_var_01;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = -(local_40 / local_28);
  auVar3 = vfmadd213sd_fma(auVar6._0_16_,auVar3,ZEXT816(0x3ff0000000000000));
  in_RDI[1].cb = (field3d<cellb> *)(auVar3._0_8_ * 0.25);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_RDI[1]._vptr_maxwell_solver;
  auVar3 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar9,ZEXT816(0x3ff0000000000000));
  in_RDI[1].cj = auVar3._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = in_RDI[1].ce;
  auVar3 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar10,ZEXT816(0x3ff0000000000000));
  in_RDI[1].dx = auVar3._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = in_RDI[1].cb;
  auVar3 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar11,ZEXT816(0x3ff0000000000000));
  in_RDI[1].dy = auVar3._0_8_;
  return;
}

Assistant:

five_point_solver::five_point_solver(field3d<celle> & ce0, field3d<cellb> & cb0, field3d<cellj> & cj0, double dt, double dx,
        double dy, double dz) :
        maxwell_solver(ce0, cb0, cj0, dt, dx, dy, dz),
        ax(0.25 * (1 - dx / dt * sin(0.5 * PI * std::min(1.0, dt / dx)))),
        ay(0.25 * (1 - dy / dt * sin(0.5 * PI * std::min(1.0, dt / dy)))),
        az(0.25 * (1 - dz / dt * sin(0.5 * PI * std::min(1.0, dt / dz)))) {
    bx = 1 - 2 * ax;
    by = 1 - 2 * ay;
    bz = 1 - 2 * az;
}